

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O3

String * __thiscall
cplus::utils::List<int_*>::toString(String *__return_storage_ptr__,List<int_*> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringBuilder stringBuilder;
  StringBuilder local_48;
  
  paVar1 = &local_48.value.field_2;
  local_48.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124620;
  local_48.value._M_string_length = 0;
  local_48.value.field_2._M_local_buf[0] = '\0';
  local_48.value._M_dataplus._M_p = (pointer)paVar1;
  StringBuilder::append(&local_48,"cplus::utils::List(");
  StringBuilder::append(&local_48,"size:");
  StringBuilder::append(&local_48,(ulong)this->listSize);
  StringBuilder::append(&local_48,")");
  StringBuilder::toString(__return_storage_ptr__,&local_48);
  local_48.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124620;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.value._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.value._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::cplus::lang::String toString() const override {
				StringBuilder stringBuilder;
				stringBuilder.append("cplus::utils::List(");
				stringBuilder.append("size:");
				stringBuilder.append((long) size());
				stringBuilder.append(")");
				return stringBuilder.toString();
			}